

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_model_v2_smt.c
# Opt level: O1

MPP_RET bits_model_update_smt(RcModelV2SmtCtx *ctx,RK_S32 real_bit)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  RK_S32 val;
  int iVar6;
  
  if (((byte)rc_debug & 1) != 0) {
    _mpp_log_l(4,"rc_model_v2_smt","enter %p\n","bits_model_update_smt",ctx);
  }
  if (((byte)rc_debug & 1) != 0) {
    _mpp_log_l(4,"rc_model_v2_smt","enter %p\n","bits_model_update_smt",ctx);
  }
  mpp_data_update_v2(ctx->stat_bits,real_bit);
  iVar6 = ctx->bits_tgt_lower;
  ctx->pre_diff_bit_lower = iVar6 - real_bit;
  ctx->pre_diff_bit_upper = ctx->bits_tgt_upper - real_bit;
  iVar3 = real_bit + 7;
  if (-1 < real_bit) {
    iVar3 = real_bit;
  }
  lVar4 = (long)(iVar3 >> 3) + ctx->count_real_bit;
  ctx->count_real_bit = lVar4;
  ctx->count_pred_bit = ctx->count_pred_bit + (&ctx->fixed_i_pred_bit)[ctx->frame_type != 2];
  ctx->count_frame = ctx->count_frame + 1;
  if ((0xffffffffffffff < lVar4) || (0xffffffffffffff < ctx->count_pred_bit)) {
    ctx->count_real_bit = 0;
    ctx->count_pred_bit = 0;
  }
  if (ctx->change_bit_flag == 1) {
    real_bit = (real_bit << 3) / 10;
  }
  if (ctx->frame_type == 2) {
    ctx->acc_intra_count = ctx->acc_intra_count + 1;
    mpp_pid_update(&ctx->pid_lower_i,real_bit - iVar6,1);
    mpp_pid_update(&ctx->pid_upper_i,real_bit - ctx->bits_tgt_upper,1);
  }
  else {
    ctx->acc_inter_count = ctx->acc_inter_count + 1;
    mpp_data_update_v2(ctx->pid_lower_p,real_bit - iVar6);
    mpp_data_update_v2(ctx->pid_upper_p,real_bit - ctx->bits_tgt_upper);
  }
  mpp_pid_update(&ctx->pid_lower_all,real_bit - ctx->bits_tgt_lower,1);
  mpp_pid_update(&ctx->pid_upper_all,real_bit - ctx->bits_tgt_upper,1);
  iVar6 = real_bit + ctx->last_fps_bits;
  ctx->last_fps_bits = iVar6;
  if (((int)ctx->acc_inter_count + (int)ctx->acc_intra_count) %
      ((ctx->usr_cfg).fps.fps_out_num / (ctx->usr_cfg).fps.fps_out_denom) == 0) {
    iVar3 = (ctx->usr_cfg).bps_min;
    iVar1 = (ctx->usr_cfg).bps_max;
    iVar5 = iVar1 + iVar3 >> 1;
    iVar2 = iVar5 * 3;
    if (iVar2 == iVar6 * 2 || SBORROW4(iVar2,iVar6 * 2) != iVar2 + iVar6 * -2 < 0) {
      val = ((iVar3 << 2) / 10 - iVar6) + (iVar1 * 6) / 10;
    }
    else {
      val = iVar5 - iVar6;
    }
    mpp_pid_update(&ctx->pid_fps,val,0);
    ctx->last_fps_bits = 0;
  }
  ctx->qp_prev_out = ctx->qp_out;
  if (((byte)rc_debug & 1) != 0) {
    _mpp_log_l(4,"rc_model_v2_smt","leave %p\n","bits_model_update_smt",ctx);
  }
  return MPP_OK;
}

Assistant:

MPP_RET bits_model_update_smt(RcModelV2SmtCtx *ctx, RK_S32 real_bit)
{
    rc_dbg_func("enter %p\n", ctx);
    RcFpsCfg *fps = &ctx->usr_cfg.fps;
    RK_S32 bps_target_tmp = 0;
    RK_S32 mod = 0;

    rc_dbg_func("enter %p\n", ctx);

    mpp_data_update_v2(ctx->stat_bits, real_bit);
    ctx->pre_diff_bit_lower = ctx->bits_tgt_lower - real_bit;
    ctx->pre_diff_bit_upper = ctx->bits_tgt_upper - real_bit;

    ctx->count_real_bit = ctx->count_real_bit + real_bit / 8;
    if (ctx->frame_type == INTRA_FRAME) {
        ctx->count_pred_bit = ctx->count_pred_bit + ctx->fixed_i_pred_bit;
    } else {
        ctx->count_pred_bit = ctx->count_pred_bit + ctx->fixed_p_pred_bit;
    }
    ctx->count_frame ++;
    if (ctx->count_real_bit > 72057594037927935 || ctx->count_pred_bit > 72057594037927935) {
        ctx->count_real_bit = 0;
        ctx->count_pred_bit = 0;
    }

    if (ctx->change_bit_flag == 1) {
        real_bit = real_bit * 8 / 10;
    }

    if (ctx->frame_type == INTRA_FRAME) {
        ctx->acc_intra_count++;
        mpp_pid_update(&ctx->pid_lower_i, real_bit - ctx->bits_tgt_lower, 1);
        mpp_pid_update(&ctx->pid_upper_i, real_bit - ctx->bits_tgt_upper, 1);
    } else {
        ctx->acc_inter_count++;
        mpp_data_update_v2(ctx->pid_lower_p, real_bit - ctx->bits_tgt_lower);
        mpp_data_update_v2(ctx->pid_upper_p, real_bit - ctx->bits_tgt_upper);
    }
    mpp_pid_update(&ctx->pid_lower_all, real_bit - ctx->bits_tgt_lower, 1);
    mpp_pid_update(&ctx->pid_upper_all, real_bit - ctx->bits_tgt_upper, 1);

    ctx->last_fps_bits += real_bit;
    /* new fps start */
    mod = ctx->acc_intra_count + ctx->acc_inter_count;
    mod = mod % (fps->fps_out_num / fps->fps_out_denom);
    if (0 == mod) {
        bps_target_tmp = (ctx->usr_cfg.bps_min + ctx->usr_cfg.bps_max) >> 1;
        if (bps_target_tmp * 3 > (ctx->last_fps_bits * 2))
            mpp_pid_update(&ctx->pid_fps, bps_target_tmp - ctx->last_fps_bits, 0);
        else {
            bps_target_tmp = ctx->usr_cfg.bps_min * 4 / 10 + ctx->usr_cfg.bps_max * 6 / 10;
            mpp_pid_update(&ctx->pid_fps, bps_target_tmp - ctx->last_fps_bits, 0);
        }
        ctx->last_fps_bits = 0;
    }

    /* new frame start */
    ctx->qp_prev_out = ctx->qp_out;

    rc_dbg_func("leave %p\n", ctx);

    return MPP_OK;
}